

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

Descriptor *
google::protobuf::internal::CheckNotNull<google::protobuf::Descriptor_const>
          (char *param_1,int param_2,char *name,Descriptor *val)

{
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (val == (Descriptor *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/logging.h"
               ,0xa8);
    other = LogMessage::operator<<(&local_60,name);
    LogFinisher::operator=(&local_21,other);
    LogMessage::~LogMessage(&local_60);
  }
  return val;
}

Assistant:

T* CheckNotNull(const char* /* file */, int /* line */,
                const char* name, T* val) {
  if (val == nullptr) {
    GOOGLE_LOG(FATAL) << name;
  }
  return val;
}